

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest.hpp
# Opt level: O0

tuple<lest::options,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
* lest::split_arguments
            (tuple<lest::options,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *__return_storage_ptr__,texts *args)

{
  bool bVar1;
  bool bVar2;
  reference __x;
  char *pcVar3;
  runtime_error *this;
  byte local_299;
  char local_208 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8 [32];
  string local_1c8 [39];
  allocator local_1a1;
  string local_1a0 [32];
  string local_180 [39];
  allocator local_159;
  string local_158 [36];
  int local_134;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130 [32];
  string local_110 [32];
  tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_f0;
  string local_b0 [8];
  text val;
  string local_90 [8];
  text opt;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *arg;
  iterator __end1;
  iterator __begin1;
  texts *__range1;
  undefined1 local_48 [7];
  bool in_options;
  texts in;
  options option;
  texts *args_local;
  
  options::options((options *)
                   &in.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_48);
  bVar1 = true;
  __end1 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin(args);
  arg = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::end(args);
  do {
    bVar2 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)&arg);
    if (!bVar2) {
      local_299 = 1;
      if ((in.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage._6_1_ & 1) == 0) {
        local_299 = in.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_;
      }
      in.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._6_1_ = local_299 & 1;
      std::
      make_tuple<lest::options&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&>
                (__return_storage_ptr__,
                 (options *)
                 &in.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_48);
      local_134 = 1;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_48);
      return __return_storage_ptr__;
    }
    __x = __gnu_cxx::
          __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::operator*(&__end1);
    if (bVar1) {
      std::__cxx11::string::string(local_90);
      std::__cxx11::string::string(local_b0);
      std::__cxx11::string::string(local_110,(string *)__x);
      split_option(&local_f0,(text *)local_110);
      std::tie<std::__cxx11::string,std::__cxx11::string>
                (local_130,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_90);
      std::tuple<std::__cxx11::string&,std::__cxx11::string&>::operator=
                ((tuple<std::__cxx11::string&,std::__cxx11::string&> *)local_130,&local_f0);
      std::
      tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~tuple(&local_f0);
      std::__cxx11::string::~string(local_110);
      pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)local_90);
      if (*pcVar3 == '-') {
        bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_90,"--");
        if (bVar2) {
          bVar1 = false;
          local_134 = 3;
        }
        else {
          bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_90,"-h");
          if ((bVar2) ||
             (bVar2 = std::operator==("--help",(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                *)local_90), bVar2)) {
            in.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 1;
            local_134 = 3;
          }
          else {
            bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)local_90,"-a");
            if ((bVar2) ||
               (bVar2 = std::operator==("--abort",
                                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)local_90), bVar2)) {
              in.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage._1_1_ = 1;
              local_134 = 3;
            }
            else {
              bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)local_90,"-c");
              if ((bVar2) ||
                 (bVar2 = std::operator==("--count",
                                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)local_90), bVar2)) {
                in.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage._2_1_ = 1;
                local_134 = 3;
              }
              else {
                bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)local_90,"-g");
                if ((bVar2) ||
                   (bVar2 = std::operator==("--list-tags",
                                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                             *)local_90), bVar2)) {
                  in.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_1_ = 1;
                  local_134 = 3;
                }
                else {
                  bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)local_90,"-l");
                  if ((bVar2) ||
                     (bVar2 = std::operator==("--list-tests",
                                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                               *)local_90), bVar2)) {
                    in.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage._3_1_ = 1;
                    local_134 = 3;
                  }
                  else {
                    bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                             *)local_90,"-t");
                    if ((bVar2) ||
                       (bVar2 = std::operator==("--time",(
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_90), bVar2)) {
                      in.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage._5_1_ = 1;
                      local_134 = 3;
                    }
                    else {
                      bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                               *)local_90,"-p");
                      if ((bVar2) ||
                         (bVar2 = std::operator==("--pass",(
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_90), bVar2)) {
                        in.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage._6_1_ = 1;
                        local_134 = 3;
                      }
                      else {
                        bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                 *)local_90,"-z");
                        if ((bVar2) ||
                           (bVar2 = std::operator==("--pass-zen",
                                                    (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_90), bVar2)) {
                          in.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = 1;
                          local_134 = 3;
                        }
                        else {
                          bVar2 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_90,"-v");
                          if ((bVar2) ||
                             (bVar2 = std::operator==("--verbose",
                                                      (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_90), bVar2)) {
                            local_134 = 3;
                          }
                          else {
                            bVar2 = std::operator==("--version",
                                                    (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_90);
                            if (bVar2) {
                              local_134 = 3;
                            }
                            else {
                              bVar2 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_90,"--order");
                              if ((bVar2) &&
                                 (bVar2 = std::operator==("declared",
                                                          (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_b0), bVar2)) {
                                local_134 = 3;
                              }
                              else {
                                bVar2 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_90,"--order");
                                if ((bVar2) &&
                                   (bVar2 = std::operator==("lexical",
                                                            (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_b0), bVar2)) {
                                  local_134 = 3;
                                }
                                else {
                                  bVar2 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_90,"--order");
                                  if ((bVar2) &&
                                     (bVar2 = std::operator==("random",(
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_b0), bVar2)) {
                                    local_134 = 3;
                                  }
                                  else {
                                    bVar2 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_90,"--random-seed");
                                    if (bVar2) {
                                      std::allocator<char>::allocator();
                                      std::__cxx11::string::string
                                                (local_158,"--random-seed",&local_159);
                                      std::__cxx11::string::string(local_180,local_b0);
                                      seed((text *)local_158,(text *)local_180);
                                      std::__cxx11::string::~string(local_180);
                                      std::__cxx11::string::~string(local_158);
                                      std::allocator<char>::~allocator
                                                ((allocator<char> *)&local_159);
                                      local_134 = 3;
                                    }
                                    else {
                                      bVar2 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_90,"--repeat");
                                      if (!bVar2) {
                                        this = (runtime_error *)__cxa_allocate_exception(0x10);
                                        std::operator+(local_208,
                                                       (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)"unrecognised option \'");
                                        std::operator+(local_1e8,local_208);
                                        std::runtime_error::runtime_error(this,(string *)local_1e8);
                                        __cxa_throw(this,&std::runtime_error::typeinfo,
                                                    std::runtime_error::~runtime_error);
                                      }
                                      std::allocator<char>::allocator();
                                      std::__cxx11::string::string(local_1a0,"--repeat",&local_1a1);
                                      std::__cxx11::string::string(local_1c8,local_b0);
                                      repeat((text *)local_1a0,(text *)local_1c8);
                                      std::__cxx11::string::~string(local_1c8);
                                      std::__cxx11::string::~string(local_1a0);
                                      std::allocator<char>::~allocator
                                                ((allocator<char> *)&local_1a1);
                                      local_134 = 3;
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
      else {
        bVar1 = false;
        local_134 = 0;
      }
      std::__cxx11::string::~string(local_b0);
      std::__cxx11::string::~string(local_90);
      if (local_134 == 0) goto LAB_00108308;
    }
    else {
LAB_00108308:
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_48,__x);
    }
    __gnu_cxx::
    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&__end1);
  } while( true );
}

Assistant:

inline auto split_arguments( texts args ) -> std::tuple<options, texts>
{
    options option; texts in;

    bool in_options = true;

    for ( auto & arg : args )
    {
        if ( in_options )
        {
            text opt, val;
            std::tie( opt, val ) = split_option( arg );

            if      ( opt[0] != '-'                             ) { in_options     = false;           }
            else if ( opt == "--"                               ) { in_options     = false; continue; }
            else if ( opt == "-h"      || "--help"       == opt ) { option.help    =  true; continue; }
            else if ( opt == "-a"      || "--abort"      == opt ) { option.abort   =  true; continue; }
            else if ( opt == "-c"      || "--count"      == opt ) { option.count   =  true; continue; }
            else if ( opt == "-g"      || "--list-tags"  == opt ) { option.tags    =  true; continue; }
            else if ( opt == "-l"      || "--list-tests" == opt ) { option.list    =  true; continue; }
            else if ( opt == "-t"      || "--time"       == opt ) { option.time    =  true; continue; }
            else if ( opt == "-p"      || "--pass"       == opt ) { option.pass    =  true; continue; }
            else if ( opt == "-z"      || "--pass-zen"   == opt ) { option.zen     =  true; continue; }
            else if ( opt == "-v"      || "--verbose"    == opt ) { option.verbose =  true; continue; }
            else if (                     "--version"    == opt ) { option.version =  true; continue; }
            else if ( opt == "--order" && "declared"     == val ) { /* by definition */   ; continue; }
            else if ( opt == "--order" && "lexical"      == val ) { option.lexical =  true; continue; }
            else if ( opt == "--order" && "random"       == val ) { option.random  =  true; continue; }
            else if ( opt == "--random-seed" ) { option.seed   = seed  ( "--random-seed", val ); continue; }
            else if ( opt == "--repeat"      ) { option.repeat = repeat( "--repeat"     , val ); continue; }
            else throw std::runtime_error( "unrecognised option '" + arg + "' (try option --help)" );
        }
        in.push_back( arg );
    }
    option.pass = option.pass || option.zen;

    return std::make_tuple( option, in );
}